

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O3

decaf_bool_t decaf_255_scalar_eq(decaf_255_scalar_s *a,decaf_255_scalar_s *b)

{
  return ~-(ulong)((b->limb[3] != a->limb[3] || b->limb[1] != a->limb[1]) ||
                  (b->limb[2] != a->limb[2] || b->limb[0] != a->limb[0]));
}

Assistant:

decaf_bool_t
API_NS(scalar_eq) (
    const scalar_t a,
    const scalar_t b
) {
    decaf_word_t diff = 0;
    unsigned int i;
    for (i=0; i<SCALAR_LIMBS; i++) {
        diff |= a->limb[i] ^ b->limb[i];
    }
    return mask_to_bool(word_is_zero(diff));
}